

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
__thiscall wabt::MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&>(wabt *this,Location *args)

{
  Location *loc;
  ElemSegmentModuleField *this_00;
  string_view local_28;
  Location *local_18;
  Location *args_local;
  
  local_18 = args;
  args_local = (Location *)this;
  this_00 = (ElemSegmentModuleField *)operator_new(0xe8);
  loc = local_18;
  string_view::string_view(&local_28);
  ElemSegmentModuleField::ElemSegmentModuleField(this_00,loc,local_28);
  std::unique_ptr<wabt::ElemSegmentModuleField,std::default_delete<wabt::ElemSegmentModuleField>>::
  unique_ptr<std::default_delete<wabt::ElemSegmentModuleField>,void>
            ((unique_ptr<wabt::ElemSegmentModuleField,std::default_delete<wabt::ElemSegmentModuleField>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}